

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O1

void anurbs::RTree<3L>::register_python(module *m)

{
  class_<anurbs::RTree<3l>> *pcVar1;
  string name;
  bool local_311;
  class_<anurbs::RTree<3L>_> local_310;
  object local_308;
  object local_300;
  object local_2f8;
  int local_2ec;
  arg local_2e8;
  arg local_2d8;
  code *local_2c8;
  undefined8 local_2c0;
  arg local_2b8;
  arg local_2a8;
  code *local_298;
  undefined8 local_290;
  arg local_288;
  arg local_278;
  code *local_268;
  undefined8 local_260;
  code *local_258;
  undefined8 local_250;
  arg local_248;
  long *local_238;
  long local_228 [2];
  arg_v local_218;
  arg_v local_1d8;
  arg_v local_198;
  arg_v local_158;
  arg_v local_118;
  arg local_d8;
  arg local_c8;
  code *local_b8;
  undefined8 local_b0;
  code *local_a8;
  undefined8 local_a0;
  code *local_98;
  undefined8 local_90;
  code *local_88;
  undefined8 local_80;
  code *local_78;
  undefined8 local_70;
  code *local_68;
  undefined8 local_60;
  code *local_58;
  undefined8 local_50;
  code *local_48;
  undefined8 local_40;
  arg local_38;
  
  RTree<3l>::python_name_abi_cxx11_();
  pybind11::class_<anurbs::RTree<3L>_>::class_<>
            (&local_310,(m->super_object).super_handle.m_ptr,(char *)local_238);
  local_248.name = "nb_items";
  local_248._8_1_ = 2;
  local_2ec = 0x10;
  local_1d8.super_arg.name = "node_size";
  local_1d8.super_arg._8_1_ = 2;
  pybind11::arg_v::arg_v<int>(&local_118,&local_1d8.super_arg,&local_2ec,(char *)0x0);
  pybind11::class_<anurbs::RTree<3L>_>::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_oberbichler[P]ANurbs_external_libraries_pybind11_include_pybind11_detail_init_h:173:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg,_pybind11::arg_v>
            (&local_310,"__init__",(type *)&local_1d8,(is_new_style_constructor *)&local_218,
             &local_248,&local_118);
  local_48 = boxes_min;
  local_40 = 0;
  pcVar1 = (class_<anurbs::RTree<3l>> *)
           pybind11::class_<anurbs::RTree<3l>>::
           def_property_readonly<std::vector<Eigen::Matrix<double,1,3,1,1,3>,std::allocator<Eigen::Matrix<double,1,3,1,1,3>>>const&(anurbs::RTree<3l>::*)()const>
                     ((class_<anurbs::RTree<3l>> *)&local_310,"_boxes_min",
                      (offset_in_Model_to_subr *)&local_48);
  local_58 = boxes_max;
  local_50 = 0;
  pcVar1 = (class_<anurbs::RTree<3l>> *)
           pybind11::class_<anurbs::RTree<3l>>::
           def_property_readonly<std::vector<Eigen::Matrix<double,1,3,1,1,3>,std::allocator<Eigen::Matrix<double,1,3,1,1,3>>>const&(anurbs::RTree<3l>::*)()const>
                     (pcVar1,"_boxes_max",(offset_in_Model_to_subr *)&local_58);
  local_68 = indices;
  local_60 = 0;
  pcVar1 = (class_<anurbs::RTree<3l>> *)
           pybind11::class_<anurbs::RTree<3l>>::
           def_property_readonly<std::vector<long,std::allocator<long>>const&(anurbs::RTree<3l>::*)()const>
                     (pcVar1,"indices",(offset_in_Model_to_subr *)&local_68);
  local_78 = min;
  local_70 = 0;
  pcVar1 = (class_<anurbs::RTree<3l>> *)
           pybind11::class_<anurbs::RTree<3l>>::
           def_property_readonly<Eigen::Matrix<double,1,3,1,1,3>(anurbs::RTree<3l>::*)()const>
                     (pcVar1,"min",(offset_in_Model_to_subr *)&local_78);
  local_88 = min;
  local_80 = 0;
  pcVar1 = (class_<anurbs::RTree<3l>> *)
           pybind11::class_<anurbs::RTree<3l>>::
           def_property_readonly<Eigen::Matrix<double,1,3,1,1,3>(anurbs::RTree<3l>::*)()const>
                     (pcVar1,"max",(offset_in_Model_to_subr *)&local_88);
  local_98 = nb_items;
  local_90 = 0;
  pcVar1 = (class_<anurbs::RTree<3l>> *)
           pybind11::class_<anurbs::RTree<3l>>::
           def_property_readonly<long(anurbs::RTree<3l>::*)()const>
                     (pcVar1,"nb_items",(offset_in_Model_to_subr *)&local_98);
  local_a8 = node_size;
  local_a0 = 0;
  pcVar1 = (class_<anurbs::RTree<3l>> *)
           pybind11::class_<anurbs::RTree<3l>>::
           def_property_readonly<long(anurbs::RTree<3l>::*)()const>
                     (pcVar1,"node_size",(offset_in_Model_to_subr *)&local_a8);
  local_b8 = add;
  local_b0 = 0;
  local_c8.name = "box_a";
  local_c8._8_1_ = 2;
  local_d8.name = "box_b";
  local_d8._8_1_ = 2;
  pcVar1 = (class_<anurbs::RTree<3l>> *)
           pybind11::class_<anurbs::RTree<3l>>::
           def<void(anurbs::RTree<3l>::*)(Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>),pybind11::arg,pybind11::arg>
                     (pcVar1,"add",(offset_in_Model_to_subr *)&local_b8,&local_c8,&local_d8);
  local_258 = finish;
  local_250 = 0;
  local_311 = true;
  local_218.super_arg.name = "hilbert_sort";
  local_218.super_arg._8_1_ = 2;
  pybind11::arg_v::arg_v<bool>(&local_1d8,&local_218.super_arg,&local_311,(char *)0x0);
  pcVar1 = (class_<anurbs::RTree<3l>> *)
           pybind11::class_<anurbs::RTree<3l>>::
           def<void(anurbs::RTree<3l>::*)(bool),pybind11::arg_v>
                     (pcVar1,"finish",(offset_in_Model_to_subr *)&local_258,&local_1d8);
  local_268 = by_point;
  local_260 = 0;
  local_278.name = "location";
  local_278._8_1_ = 2;
  local_288.name = "tolerance";
  local_288._8_1_ = 2;
  local_2f8.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_158.super_arg.name = "callback";
  local_158.super_arg._8_1_ = 2;
  pybind11::arg_v::arg_v<pybind11::none>
            (&local_218,&local_158.super_arg,(none *)&local_2f8,(char *)0x0);
  pcVar1 = (class_<anurbs::RTree<3l>> *)
           pybind11::class_<anurbs::RTree<3l>>::
           def<std::vector<long,std::allocator<long>>(anurbs::RTree<3l>::*)(Eigen::Matrix<double,1,3,1,1,3>,double,std::function<bool(long)>),pybind11::arg,pybind11::arg,pybind11::arg_v>
                     (pcVar1,"by_point",(offset_in_Model_to_subr *)&local_268,&local_278,&local_288,
                      &local_218);
  local_298 = by_box;
  local_290 = 0;
  local_2a8.name = "box_a";
  local_2a8._8_1_ = 2;
  local_2b8.name = "box_b";
  local_2b8._8_1_ = 2;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_300.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  local_198.super_arg.name = "callback";
  local_198.super_arg._8_1_ = 2;
  pybind11::arg_v::arg_v<pybind11::none>
            (&local_158,&local_198.super_arg,(none *)&local_300,(char *)0x0);
  pcVar1 = (class_<anurbs::RTree<3l>> *)
           pybind11::class_<anurbs::RTree<3l>>::
           def<std::vector<long,std::allocator<long>>(anurbs::RTree<3l>::*)(Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>,std::function<bool(long)>),pybind11::arg,pybind11::arg,pybind11::arg_v>
                     (pcVar1,"by_box",(offset_in_Model_to_subr *)&local_298,&local_2a8,&local_2b8,
                      &local_158);
  local_2c8 = by_ray;
  local_2c0 = 0;
  local_2d8.name = "origin";
  local_2d8._8_1_ = 2;
  local_2e8.name = "direction";
  local_2e8._8_1_ = 2;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_308.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  local_38.name = "callback";
  local_38._8_1_ = 2;
  pybind11::arg_v::arg_v<pybind11::none>(&local_198,&local_38,(none *)&local_308,(char *)0x0);
  pybind11::class_<anurbs::RTree<3l>>::
  def<std::vector<long,std::allocator<long>>(anurbs::RTree<3l>::*)(Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>,std::function<bool(long)>),pybind11::arg,pybind11::arg,pybind11::arg_v>
            (pcVar1,"by_ray",(offset_in_Model_to_subr *)&local_2c8,&local_2d8,&local_2e8,&local_198)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198.type._M_dataplus._M_p != &local_198.type.field_2) {
    operator_delete(local_198.type._M_dataplus._M_p,local_198.type.field_2._M_allocated_capacity + 1
                   );
  }
  pybind11::object::~object(&local_198.value);
  pybind11::object::~object(&local_308);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158.type._M_dataplus._M_p != &local_158.type.field_2) {
    operator_delete(local_158.type._M_dataplus._M_p,local_158.type.field_2._M_allocated_capacity + 1
                   );
  }
  pybind11::object::~object(&local_158.value);
  pybind11::object::~object(&local_300);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.type._M_dataplus._M_p != &local_218.type.field_2) {
    operator_delete(local_218.type._M_dataplus._M_p,local_218.type.field_2._M_allocated_capacity + 1
                   );
  }
  pybind11::object::~object(&local_218.value);
  pybind11::object::~object(&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.type._M_dataplus._M_p != &local_1d8.type.field_2) {
    operator_delete(local_1d8.type._M_dataplus._M_p,local_1d8.type.field_2._M_allocated_capacity + 1
                   );
  }
  pybind11::object::~object(&local_1d8.value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.type._M_dataplus._M_p != &local_118.type.field_2) {
    operator_delete(local_118.type._M_dataplus._M_p,local_118.type.field_2._M_allocated_capacity + 1
                   );
  }
  pybind11::object::~object(&local_118.value);
  pybind11::object::~object((object *)&local_310);
  if (local_238 != local_228) {
    operator_delete(local_238,local_228[0] + 1);
  }
  return;
}

Assistant:

static void register_python(pybind11::module& m)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        const std::string name = Type::python_name();

        py::class_<Type>(m, name.c_str())
            // constructors
            .def(py::init<Index, Index>(), "nb_items"_a, "node_size"_a=16)
            // private read-only properties
            .def_property_readonly("_boxes_min", &Type::boxes_min)
            .def_property_readonly("_boxes_max", &Type::boxes_max)
            // read-only properties
            .def_property_readonly("indices", &Type::indices)
            .def_property_readonly("min", &Type::min)
            .def_property_readonly("max", &Type::min)
            .def_property_readonly("nb_items", &Type::nb_items)
            .def_property_readonly("node_size", &Type::node_size)
            // methods
            .def("add", &Type::add, "box_a"_a, "box_b"_a)
            .def("finish", &Type::finish, "hilbert_sort"_a=true)
            .def("by_point", &Type::by_point, "location"_a, "tolerance"_a, "callback"_a=py::none())
            .def("by_box", &Type::by_box, "box_a"_a, "box_b"_a, "callback"_a=py::none())
            .def("by_ray", &Type::by_ray, "origin"_a, "direction"_a, "callback"_a=py::none())
        ;
    }